

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O2

int manual_check(nvamemtiming_conf *conf)

{
  FILE *__stream;
  char outfile [21];
  
  snprintf(outfile,0x14,"entry_%i_%i",(ulong)(conf->field_4).manual.index,
           (ulong)(conf->field_4).manual.value);
  __stream = fopen(outfile,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open the output file");
  }
  else {
    printf("Manual mode: set index %i to value 0x%x\n",(ulong)(conf->field_4).manual.index,
           (ulong)(conf->field_4).manual.value);
    (conf->vbios).data
    [(ulong)(conf->field_4).manual.index + (ulong)(conf->vbios).timing_entry_offset] =
         (conf->field_4).manual.value;
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    fclose(__stream);
  }
  return (uint)(__stream == (FILE *)0x0);
}

Assistant:

int manual_check(struct nvamemtiming_conf *conf)
{
	char outfile[21];

	snprintf(outfile, 20, "entry_%i_%i", conf->manual.index, conf->manual.value);

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(outfile, "wb");
	if (!outf) {
		perror("Open the output file");
		return 1;
	}

	printf("Manual mode: set index %i to value 0x%x\n", conf->manual.index, conf->manual.value);

	conf->vbios.data[conf->vbios.timing_entry_offset + conf->manual.index] = conf->manual.value;
	launch(conf, outf, 0, NO_COLOR);

	fclose(outf);

	return 0;
}